

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string configPropStr;
  string conf;
  string propertyNameStr;
  string configUpper;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  char *local_c8;
  long local_c0;
  string local_a8;
  allocator local_88 [32];
  char *local_68;
  long local_60;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,(string *)kind);
  if (local_60 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_68);
    pcVar4 = local_68;
  }
  std::__cxx11::string::string((string *)&local_a8,(string *)config);
  cmsys::SystemTools::UpperCase(&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)kind);
  if (local_c0 == 0) {
    local_c8 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_c8);
    std::__cxx11::string::append((string *)&local_c8);
  }
  std::__cxx11::string::string((string *)&local_e8,local_c8,local_88);
  pcVar3 = GetProperty(this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_e8,pcVar4,local_88);
    pcVar4 = GetProperty(this,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)out);
    }
  }
  else {
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::assign((char *)&local_a8);
  }
  sVar1 = out->_M_string_length;
  if (sVar1 != 0) {
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_e8,out,pcVar4);
    std::__cxx11::string::operator=((string *)out,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (local_a8._M_string_length != 0) {
      pcVar2 = this->LocalGenerator->GlobalGenerator;
      std::__cxx11::string::string((string *)&local_e8,"/",&local_e9);
      std::__cxx11::string::string((string *)local_88,"",&local_ea);
      (*pcVar2->_vptr_cmGlobalGenerator[0x10])(pcVar2,&local_e8,&local_a8,local_88,out);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)&local_e8);
    }
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  return sVar1 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                   const std::string& config,
                                   std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = 0;
  std::string propertyNameStr = kind;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = kind;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    out = outdir;
    }
  if(out.empty())
    {
    return false;
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    this->LocalGenerator->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, "", out);
    }
  return true;
}